

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall
icu_63::double_conversion::Bignum::AssignHexString(Bignum *this,Vector<const_char> value)

{
  char cVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  
  if (0 < this->used_digits_) {
    puVar2 = (this->bigits_).start_;
    lVar6 = 0;
    do {
      puVar2[lVar6] = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->used_digits_);
  }
  this->used_digits_ = 0;
  this->exponent_ = 0;
  iVar5 = value.length_;
  if (0x37f < iVar5) {
    abort();
  }
  uVar4 = iVar5 / 7;
  iVar9 = iVar5 + -1;
  if (6 < iVar5) {
    puVar2 = (this->bigits_).start_;
    uVar10 = 0;
    do {
      pcVar7 = value.start_ + iVar9;
      iVar5 = 0;
      uVar8 = 0;
      do {
        cVar1 = *pcVar7;
        iVar11 = (uint)(5 < (byte)(cVar1 + 0x9fU)) * 0x20 + -0x57;
        if ((byte)(cVar1 - 0x30U) < 10) {
          iVar11 = -0x30;
        }
        uVar8 = uVar8 + (iVar11 + cVar1 << ((byte)iVar5 & 0x1f));
        pcVar7 = pcVar7 + -1;
        iVar5 = iVar5 + 4;
      } while (iVar5 != 0x1c);
      iVar9 = iVar9 + -7;
      puVar2[uVar10] = uVar8;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar4);
  }
  this->used_digits_ = uVar4;
  if (iVar9 < 0) {
    uVar8 = 0;
  }
  else {
    uVar10 = 0;
    uVar8 = 0;
    do {
      cVar1 = value.start_[uVar10];
      iVar5 = (uint)(5 < (byte)(cVar1 + 0x9fU)) * 0x20 + -0x57;
      if ((byte)(cVar1 - 0x30U) < 10) {
        iVar5 = -0x30;
      }
      uVar8 = uVar8 * 0x10 + (int)cVar1 + iVar5;
      uVar10 = uVar10 + 1;
    } while (iVar9 + 1 != uVar10);
  }
  if (uVar8 != 0) {
    (this->bigits_).start_[(int)uVar4] = uVar8;
    this->used_digits_ = this->used_digits_ + 1;
  }
  lVar6 = (long)this->used_digits_;
  if (0 < lVar6) {
    puVar2 = (this->bigits_).start_;
    do {
      if (puVar2[lVar6 + -1] != 0) goto LAB_00287d7e;
      this->used_digits_ = (int)lVar6 + -1;
      bVar3 = 1 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar3);
    lVar6 = 0;
  }
LAB_00287d7e:
  if ((int)lVar6 == 0) {
    this->exponent_ = 0;
  }
  return;
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  int length = value.length();

  int needed_bigits = length * 4 / kBigitSize + 1;
  EnsureCapacity(needed_bigits);
  int string_index = length - 1;
  for (int i = 0; i < needed_bigits - 1; ++i) {
    // These bigits are guaranteed to be "full".
    Chunk current_bigit = 0;
    for (int j = 0; j < kBigitSize / 4; j++) {
      current_bigit += HexCharValue(value[string_index--]) << (j * 4);
    }
    bigits_[i] = current_bigit;
  }
  used_digits_ = needed_bigits - 1;

  Chunk most_significant_bigit = 0;  // Could be = 0;
  for (int j = 0; j <= string_index; ++j) {
    most_significant_bigit <<= 4;
    most_significant_bigit += HexCharValue(value[j]);
  }
  if (most_significant_bigit != 0) {
    bigits_[used_digits_] = most_significant_bigit;
    used_digits_++;
  }
  Clamp();
}